

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O2

void test08(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_read(qpdf,infile,password);
  qpdf_init_write(qpdf,outfile);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_qdf_mode(qpdf,1);
  qpdf_set_suppress_original_object_IDs(qpdf,1);
  qpdf_write(qpdf);
  report_errors();
  return;
}

Assistant:

static void
test08(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_qdf_mode(qpdf, QPDF_TRUE);
    qpdf_set_suppress_original_object_IDs(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
}